

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase71::run(TestCase71 *this)

{
  anon_union_1_1_a8c68091_for_NullableValue<char>_2 *params_2;
  Maybe<char> result;
  Input input;
  Maybe<char> result_3;
  CharGroup_ parser;
  
  parser.bits[2] = 0;
  parser.bits[3] = 0;
  parser.bits[0] = 0;
  parser.bits[1] = 0x7fffffe00000000;
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "a";
  input.end = "";
  input.best = "a";
  CharGroup_::operator()((CharGroup_ *)&result,(IteratorInput<char,_const_char_*> *)&parser);
  params_2 = &result.ptr.field_1;
  if (result.ptr.isSet == true) {
    if ((result.ptr.field_1.value != 'a') && (kj::_::Debug::minSeverity < 3)) {
      result_3.ptr.isSet = true;
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x4f,ERROR,"\"failed: expected \" \"(\'a\') == (*value)\", \'a\', *value",
                 (char (*) [35])"failed: expected (\'a\') == (*value)",(char *)&result_3,
                 &params_2->value);
    }
  }
  else {
    result_3.ptr.isSet = false;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_3,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_3);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x53,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "n";
  input.end = "";
  input.best = "n";
  CharGroup_::operator()((CharGroup_ *)&result,(IteratorInput<char,_const_char_*> *)&parser);
  if (result.ptr.isSet == true) {
    if ((result.ptr.field_1.value != 'n') && (kj::_::Debug::minSeverity < 3)) {
      result_3.ptr.isSet = true;
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x5b,ERROR,"\"failed: expected \" \"(\'n\') == (*value)\", \'n\', *value",
                 (char (*) [35])"failed: expected (\'n\') == (*value)",(char *)&result_3,
                 &params_2->value);
    }
  }
  else {
    result_3.ptr.isSet = false;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_3,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_3);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "z";
  input.end = "";
  input.best = "z";
  CharGroup_::operator()((CharGroup_ *)&result,(IteratorInput<char,_const_char_*> *)&parser);
  if (result.ptr.isSet == true) {
    if ((result.ptr.field_1.value != 'z') && (kj::_::Debug::minSeverity < 3)) {
      result_3.ptr.isSet = true;
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x67,ERROR,"\"failed: expected \" \"(\'z\') == (*value)\", \'z\', *value",
                 (char (*) [35])"failed: expected (\'z\') == (*value)",(char *)&result_3,
                 &params_2->value);
    }
  }
  else {
    result_3.ptr.isSet = false;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_3,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_3);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x6b,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "`";
  input.end = "";
  input.best = "`";
  CharGroup_::operator()((CharGroup_ *)&result_3,(IteratorInput<char,_const_char_*> *)&parser);
  if ((result_3.ptr.isSet & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x72,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  if ((input.pos == input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x73,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "{";
  input.end = "";
  input.best = "{";
  CharGroup_::operator()((CharGroup_ *)&result_3,(IteratorInput<char,_const_char_*> *)&parser);
  if ((result_3.ptr.isSet & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x7a,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  if ((input.pos == input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x7b,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "A";
  input.end = "";
  input.best = "A";
  CharGroup_::operator()((CharGroup_ *)&result_3,(IteratorInput<char,_const_char_*> *)&parser);
  if ((result_3.ptr.isSet & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x82,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  if ((input.pos == input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x83,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return;
}

Assistant:

TEST(CharParsers, CharRange) {
  constexpr auto parser = charRange('a', 'z');

  {
    StringPtr text = "a";
    Input input(text.begin(), text.end());
    Maybe<char> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ('a', *value);
    } else {
      ADD_FAILURE() << "Expected parse result, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }